

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::SubtractRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lowerChar,Char higherChar)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  uint uVar6;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  uint uVar7;
  CharSetNode *pCVar8;
  Char CVar9;
  uint l;
  ulong uVar10;
  
  uVar10 = CONCAT62(in_register_00000012,lowerChar) & 0xffffffff;
  uVar6 = (uint)CONCAT62(in_register_0000000a,higherChar);
  CVar9 = (Char)uVar10;
  if ((ushort)CVar9 <= (ushort)higherChar) {
    pCVar8 = (this->rep).full.root;
    l = (uint)CONCAT62(in_register_00000012,lowerChar);
    if ((undefined1 *)((long)&pCVar8[-1]._vptr_CharSetNode + 7) < (undefined1 *)0x5) {
      uVar7 = 0;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      while( true ) {
        if ((undefined1 *)0x4 < (undefined1 *)((long)&pCVar8[-1]._vptr_CharSetNode + 7)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x1ef,"(IsCompact())","IsCompact()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          pCVar8 = (CharSetNode *)(this->rep).compact.countPlusOne;
        }
        if ((int)pCVar8 - 1U <= uVar7) break;
        uVar3 = GetCompactCharU(this,uVar7);
        if (uVar6 < uVar3 || uVar3 < l) {
          uVar7 = uVar7 + 1;
        }
        else {
          RemoveCompactChar(this,uVar7);
        }
        pCVar8 = (CharSetNode *)(this->rep).compact.countPlusOne;
      }
    }
    else if (higherChar == L'\xffff' && CVar9 == L'\0') {
      if ((CharSetNode *)&DAT_00000005 < pCVar8) {
        (**pCVar8->_vptr_CharSetNode)(pCVar8,allocator);
      }
      (this->rep).compact.countPlusOne = 1;
      (this->rep).compact.cs[0] = 0xffffffff;
      (this->rep).compact.cs[1] = 0xffffffff;
      (this->rep).compact.cs[2] = 0xffffffff;
      (this->rep).compact.cs[3] = 0xffffffff;
    }
    else {
      if ((ushort)lowerChar < 0x100) {
        uVar7 = 0xff;
        if (uVar6 < 0xff) {
          uVar7 = uVar6;
        }
        CharBitvec::ClearRange(&(this->rep).full.direct,l,uVar7);
        pCVar8 = (this->rep).full.root;
      }
      if (pCVar8 != (CharSetNode *)0x0) {
        iVar4 = (*pCVar8->_vptr_CharSetNode[3])
                          (pCVar8,allocator,2,uVar10,
                           CONCAT62(in_register_0000000a,higherChar) & 0xffffffff);
        (this->rep).compact.countPlusOne = CONCAT44(extraout_var,iVar4);
      }
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SubtractRange(ArenaAllocator* allocator, Char lowerChar, Char higherChar)
    {
        uint lowerValue = CTU(lowerChar);
        uint higherValue = CTU(higherChar);

        if (higherValue < lowerValue)
            return;

        if (IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); )
            {
                uint value = this->GetCompactCharU(i);

                if (value >= lowerValue && value <= higherValue)
                {
                    this->RemoveCompactChar(i);
                }
                else
                {
                    i++;
                }
            }
        }
        else if(lowerValue == 0 && higherValue == MaxUChar)
        {
            this->Clear(allocator);
        }
        else
        {
            if (lowerValue < CharSetNode::directSize)
            {
                uint maxDirectValue = min(higherValue, CharSetNode::directSize - 1);
                rep.full.direct.ClearRange(lowerValue, maxDirectValue);
            }

            if (rep.full.root != nullptr)
            {
                rep.full.root = rep.full.root->ClearRange(allocator, CharSetNode::levels - 1, lowerValue, higherValue);
            }
        }
    }